

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sct_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  pointer psVar3;
  pointer psVar4;
  CRYPTO_BUFFER *__p;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    uVar2 = ssl_protocol_version(ssl_00);
    if (uVar2 < 0x304) {
      if ((*(ushort *)&hs->config->field_0x10d >> 1 & 1) == 0) {
        __assert_fail("hs->config->signed_cert_timestamps_enabled",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x4ff,
                      "bool bssl::ext_sct_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      bVar1 = ssl_is_sct_list_valid(contents);
      if (bVar1) {
        if ((*(ushort *)&ssl_00->s3->field_0xdc >> 5 & 1) == 0) {
          psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                             (&hs->new_session);
          psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
          __p = CRYPTO_BUFFER_new_from_CBS(contents,psVar4->pool);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::reset
                    (&psVar3->signed_cert_timestamp_list,__p);
          psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                             (&hs->new_session);
          bVar1 = std::operator==(&psVar3->signed_cert_timestamp_list,(nullptr_t)0x0);
          if (bVar1) {
            *out_alert = 'P';
            return false;
          }
        }
        hs_local._7_1_ = true;
      }
      else {
        *out_alert = '2';
        hs_local._7_1_ = false;
      }
    }
    else {
      *out_alert = '2';
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_sct_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // TLS 1.3 SCTs are included in the Certificate extensions.
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // If this is false then we should never have sent the SCT extension in the
  // ClientHello and thus this function should never have been called.
  assert(hs->config->signed_cert_timestamps_enabled);

  if (!ssl_is_sct_list_valid(contents)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // Session resumption uses the original session information. The extension
  // should not be sent on resumption, but RFC 6962 did not make it a
  // requirement, so tolerate this.
  //
  // TODO(davidben): Enforce this anyway.
  if (!ssl->s3->session_reused) {
    hs->new_session->signed_cert_timestamp_list.reset(
        CRYPTO_BUFFER_new_from_CBS(contents, ssl->ctx->pool));
    if (hs->new_session->signed_cert_timestamp_list == nullptr) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  }

  return true;
}